

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureFilteringTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Performance::TextureFilteringTests::init(TextureFilteringTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  deUint32 format;
  deUint32 dataType;
  int iVar2;
  TestNode *this_00;
  float *pfVar3;
  long *plVar4;
  Texture2DRenderCase *this_01;
  int row_2;
  long lVar5;
  long *plVar6;
  int row;
  long lVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined4 uVar15;
  allocator<char> local_139;
  Matrix<float,_3,_3> local_138;
  Matrix<float,_3,_3> res_1;
  long *local_d8;
  undefined4 local_d0;
  long local_c8 [2];
  char *local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  long local_a8;
  TestNode *local_a0;
  Mat3 *local_98;
  ulong local_90;
  ulong local_88;
  char *local_80;
  Mat3 magTransform;
  Mat3 minTransform;
  long lVar14;
  
  pfVar3 = (float *)&magTransform;
  magTransform.m_data.m_data[1].m_data[1] = 0.0;
  magTransform.m_data.m_data[1].m_data[2] = 0.0;
  magTransform.m_data.m_data[0].m_data[0] = 0.0;
  magTransform.m_data.m_data[0].m_data[1] = 0.0;
  magTransform.m_data.m_data[0].m_data[2] = 0.0;
  magTransform.m_data.m_data[1].m_data[0] = 0.0;
  magTransform.m_data.m_data[2].m_data[2] = 0.0;
  lVar5 = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    auVar12 = _DAT_019f34d0;
    do {
      bVar10 = SUB164(auVar12 ^ _DAT_019ec5b0,4) == -0x80000000 &&
               SUB164(auVar12 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
      if (bVar10) {
        uVar15 = 0x3f800000;
        if (lVar5 != lVar8) {
          uVar15 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar8) = uVar15;
      }
      if (bVar10) {
        uVar15 = 0x3f800000;
        if (lVar5 + -0xc != lVar8) {
          uVar15 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar8 + 0xc) = uVar15;
      }
      lVar14 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar14 + 2;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x30);
    lVar7 = lVar7 + 1;
    lVar5 = lVar5 + 0xc;
    pfVar3 = pfVar3 + 1;
  } while (lVar7 != 3);
  magTransform.m_data.m_data[2].m_data[0] = -0.3;
  magTransform.m_data.m_data[2].m_data[1] = -0.6;
  local_138.m_data.m_data[0].m_data[0] = 1.7;
  local_138.m_data.m_data[0].m_data[1] = 2.3;
  local_138.m_data.m_data[0].m_data[2] = 1.0;
  pfVar3 = (float *)&res_1;
  res_1.m_data.m_data[0].m_data[0] = 0.0;
  res_1.m_data.m_data[0].m_data[1] = 0.0;
  res_1.m_data.m_data[0].m_data[2] = 0.0;
  res_1.m_data.m_data[1].m_data[0] = 0.0;
  res_1.m_data.m_data[1].m_data[1] = 0.0;
  res_1.m_data.m_data[1].m_data[2] = 0.0;
  res_1.m_data.m_data[2].m_data[0] = 0.0;
  res_1.m_data.m_data[2].m_data[1] = 0.0;
  res_1.m_data.m_data[2].m_data[2] = 0.0;
  lVar5 = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      fVar11 = 0.0;
      if (lVar5 == lVar8) {
        fVar11 = local_138.m_data.m_data[0].m_data[lVar7];
      }
      *(float *)((long)pfVar3 + lVar8) = fVar11;
      lVar8 = lVar8 + 0xc;
    } while (lVar8 != 0x24);
    lVar7 = lVar7 + 1;
    pfVar3 = pfVar3 + 1;
    lVar5 = lVar5 + 0xc;
  } while (lVar7 != 3);
  pfVar3 = (float *)&res_1;
  local_b8 = (char *)0x8000000080000000;
  uStack_b0 = 0x80000000;
  uStack_ac = 0x80000000;
  tcu::operator*(&minTransform,&magTransform,(Matrix<float,_3,_3> *)pfVar3);
  iVar2 = (int)local_b8;
  res_1.m_data.m_data[1].m_data[1] = 0.0;
  res_1.m_data.m_data[1].m_data[2] = 0.0;
  res_1.m_data.m_data[0].m_data[0] = 0.0;
  res_1.m_data.m_data[0].m_data[1] = 0.0;
  res_1.m_data.m_data[0].m_data[2] = 0.0;
  res_1.m_data.m_data[1].m_data[0] = 0.0;
  res_1.m_data.m_data[2].m_data[2] = 0.0;
  lVar5 = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    auVar13 = _DAT_019f34d0;
    do {
      bVar10 = SUB164(auVar13 ^ _DAT_019ec5b0,4) == iVar2 &&
               SUB164(auVar13 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
      if (bVar10) {
        uVar15 = 0x3f800000;
        if (lVar5 != lVar8) {
          uVar15 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar8) = uVar15;
      }
      if (bVar10) {
        uVar15 = 0x3f800000;
        if (lVar5 + -0xc != lVar8) {
          uVar15 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar8 + 0xc) = uVar15;
      }
      lVar14 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 2;
      auVar13._8_8_ = lVar14 + 2;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x30);
    lVar7 = lVar7 + 1;
    lVar5 = lVar5 + 0xc;
    pfVar3 = pfVar3 + 1;
  } while (lVar7 != 3);
  res_1.m_data.m_data[2].m_data[0] = 0.3;
  res_1.m_data.m_data[2].m_data[1] = 0.4;
  local_d8 = (long *)0x3e4ccccd3e99999a;
  local_d0 = 0x3f800000;
  pfVar3 = (float *)&local_138;
  local_138.m_data.m_data[0].m_data._0_8_ = (float *)0x0;
  local_138.m_data.m_data[0].m_data[2] = 0.0;
  local_138.m_data.m_data[1].m_data[0] = 0.0;
  local_138.m_data.m_data[1].m_data[1] = 0.0;
  local_138.m_data.m_data[1].m_data[2] = 0.0;
  local_138.m_data.m_data[2].m_data[0] = 0.0;
  local_138.m_data.m_data[2].m_data[1] = 0.0;
  local_138.m_data.m_data[2].m_data[2] = 0.0;
  lVar5 = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      uVar15 = 0;
      if (lVar5 == lVar8) {
        uVar15 = *(undefined4 *)((long)&local_d8 + lVar7 * 4);
      }
      *(undefined4 *)((long)pfVar3 + lVar8) = uVar15;
      lVar8 = lVar8 + 0xc;
    } while (lVar8 != 0x24);
    lVar7 = lVar7 + 1;
    pfVar3 = pfVar3 + 1;
    lVar5 = lVar5 + 0xc;
  } while (lVar7 != 3);
  local_a0 = (TestNode *)this;
  tcu::operator*(&magTransform,&res_1,&local_138);
  local_a8 = 0;
  do {
    uVar1 = init::cases[local_a8].filter;
    local_88 = (ulong)uVar1;
    local_90 = 0x2601;
    if ((uVar1 & 0xfffffffe) == 0x2600) {
      local_90 = (ulong)uVar1;
    }
    local_b8 = init::cases[local_a8].name;
    bVar10 = init::cases[local_a8].minify != false;
    local_80 = "_magnify_";
    if (bVar10) {
      local_80 = "_minify_";
    }
    local_98 = &magTransform;
    if (bVar10) {
      local_98 = &minTransform;
    }
    lVar5 = 0;
    bVar10 = true;
    do {
      bVar9 = bVar10;
      format = init::texFormats[lVar5].format;
      dataType = init::texFormats[lVar5].dataType;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,local_b8,&local_139);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_138.m_data.m_data[0].m_data._0_8_ = local_138.m_data.m_data[1].m_data + 1;
      plVar6 = plVar4 + 2;
      if ((float *)*plVar4 == (float *)plVar6) {
        local_138.m_data.m_data[1].m_data._4_8_ = *plVar6;
        local_138.m_data.m_data[2].m_data._0_8_ = plVar4[3];
      }
      else {
        local_138.m_data.m_data[1].m_data._4_8_ = *plVar6;
        local_138.m_data.m_data[0].m_data._0_8_ = (float *)*plVar4;
      }
      local_138.m_data.m_data._8_8_ = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_138);
      res_1.m_data.m_data[0].m_data._0_8_ = res_1.m_data.m_data[1].m_data + 1;
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        res_1.m_data.m_data[1].m_data._4_8_ = *plVar6;
        res_1.m_data.m_data[2].m_data._0_8_ = plVar4[3];
      }
      else {
        res_1.m_data.m_data[1].m_data._4_8_ = *plVar6;
        res_1.m_data.m_data[0].m_data._0_8_ = (long *)*plVar4;
      }
      res_1.m_data.m_data._8_8_ = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((float *)local_138.m_data.m_data[0].m_data._0_8_ != local_138.m_data.m_data[1].m_data + 1)
      {
        operator_delete((void *)local_138.m_data.m_data[0].m_data._0_8_,
                        local_138.m_data.m_data[1].m_data._4_8_ + 1);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      this_01 = (Texture2DRenderCase *)operator_new(0x220);
      this_00 = local_a0;
      Texture2DRenderCase::Texture2DRenderCase
                (this_01,(Context *)local_a0[1]._vptr_TestNode,
                 (char *)res_1.m_data.m_data[0].m_data._0_8_,
                 glcts::fixed_sample_locations_values + 1,format,dataType,0x2901,0x2901,
                 (deUint32)local_88,(deUint32)local_90,local_98,1,true);
      tcu::TestNode::addChild(this_00,(TestNode *)this_01);
      if ((float *)res_1.m_data.m_data[0].m_data._0_8_ != res_1.m_data.m_data[1].m_data + 1) {
        operator_delete((void *)res_1.m_data.m_data[0].m_data._0_8_,
                        res_1.m_data.m_data[1].m_data._4_8_ + 1);
      }
      lVar5 = 1;
      bVar10 = false;
    } while (bVar9);
    local_a8 = local_a8 + 1;
  } while (local_a8 != 8);
  return 8;
}

Assistant:

void TextureFilteringTests::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	format;
		deUint32	dataType;
	} texFormats[] =
	{
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};
	static const struct
	{
		const char*	name;
		deUint32	filter;
		bool		minify;
	} cases[] =
	{
		{ "nearest",				GL_NEAREST,					true	},
		{ "nearest",				GL_NEAREST,					false	},
		{ "linear",					GL_LINEAR,					true	},
		{ "linear",					GL_LINEAR,					false	},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST,	true	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR,	true	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST,	true	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR,	true	}
	};

	tcu::Mat3 minTransform	= tcu::translationMatrix(tcu::Vec2(-0.3f, -0.6f)) * tcu::Mat3(tcu::Vec3(1.7f, 2.3f, 1.0f));
	tcu::Mat3 magTransform	= tcu::translationMatrix(tcu::Vec2( 0.3f,  0.4f)) * tcu::Mat3(tcu::Vec3(0.3f, 0.2f, 1.0f));

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
	{
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
		{
			deUint32	format		= texFormats[formatNdx].format;
			deUint32	dataType	= texFormats[formatNdx].dataType;
			deUint32	minFilter	= cases[caseNdx].filter;
			deUint32	magFilter	= (minFilter == GL_NEAREST || minFilter == GL_LINEAR) ? minFilter : GL_LINEAR;
			deUint32	wrapS		= GL_REPEAT;
			deUint32	wrapT		= GL_REPEAT;
			int			numTextures	= 1;
			bool		minify		= cases[caseNdx].minify;
			string		name		= string(cases[caseNdx].name) + (minify ? "_minify_" : "_magnify_") + texFormats[formatNdx].name;

			addChild(new Texture2DRenderCase(m_context, name.c_str(), "", format, dataType, wrapS, wrapT, minFilter, magFilter, minify ? minTransform : magTransform, numTextures, true /* pot */));
		}
	}
}